

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number.cpp
# Opt level: O2

Variable __thiscall LiteScript::_Type_NUMBER::OUnaryMinus(_Type_NUMBER *this,Variable *obj)

{
  Object *pOVar1;
  Variable *in_RDX;
  uint *extraout_RDX;
  Variable VVar2;
  Number NStack_18;
  
  pOVar1 = Variable::operator->(in_RDX);
  Memory::Create((Memory *)this,(Type *)pOVar1->memory);
  Variable::operator->(in_RDX);
  Number::operator-(&NStack_18);
  pOVar1 = Variable::operator->((Variable *)this);
  Number::operator=((Number *)pOVar1->data,&NStack_18);
  VVar2.nb_ref = extraout_RDX;
  VVar2.obj = (Object *)this;
  return VVar2;
}

Assistant:

LiteScript::Variable LiteScript::_Type_NUMBER::OUnaryMinus(const LiteScript::Variable& obj) const {
    Variable res = obj->memory.Create(Type::NUMBER);
    res->GetData<Number>() = -obj->GetData<Number>();
    return res;
}